

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O3

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile
          (ClassFactoredSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  _Bit_type *p_Var1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  istream *piVar6;
  pointer pvVar7;
  pointer *ppuVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  _Bit_type _Var15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint word;
  string line;
  ifstream in;
  uint local_29c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_298;
  vector<int,_std::allocator<int>_> *local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_288;
  string local_280;
  undefined1 *local_260;
  ulong local_258;
  undefined1 local_250 [16];
  Dict *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_240 = word_dict;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading clusters from ",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(cluster_file->_M_dataplus)._M_p,
                      cluster_file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...\n",5);
  std::ifstream::ifstream(local_238,(string *)cluster_file,_S_in);
  lVar10 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar10] & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x61,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  local_290 = &this->widx2cidx;
  local_260 = local_250;
  local_288 = &this->widx2cwidx;
  iVar12 = 0;
  local_298 = &this->cidx2words;
  local_258 = 0;
  local_250[0] = 0;
  do {
    cVar2 = std::ios::widen((char)local_238 + (char)lVar10);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_260,cVar2);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      iVar18 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&this->singleton_cluster,
                 ((long)(this->cidx2words).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->cidx2words).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,false)
      ;
      pvVar7 = (this->cidx2words).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->cidx2words).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7;
      if (lVar10 != 0) {
        ppuVar8 = (pointer *)
                  ((long)&(pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data + 8);
        uVar13 = 0;
        iVar18 = 0;
        uVar11 = (lVar10 >> 3) * -0x5555555555555555;
        p_Var1 = (this->singleton_cluster).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        do {
          uVar14 = 1L << (uVar13 & 0x3f);
          uVar16 = (long)*ppuVar8 - (long)((_Vector_impl_data *)(ppuVar8 + -1))->_M_start;
          iVar18 = iVar18 + (uint)(uVar16 < 5);
          uVar17 = uVar13 >> 6 & 0x3ffffff;
          if (uVar16 < 5) {
            _Var15 = uVar14 | p_Var1[uVar17];
          }
          else {
            _Var15 = ~uVar14 & p_Var1[uVar17];
          }
          uVar13 = uVar13 + 1;
          ppuVar8 = ppuVar8 + 3;
          p_Var1[uVar17] = _Var15;
        } while ((uVar13 & 0xffffffff) <= uVar11 && uVar11 - (uVar13 & 0xffffffff) != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," words in ",10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," clusters (",0xb);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," singleton clusters)\n",0x15);
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    uVar11 = 0xffffffffffffffff;
    uVar13 = local_258 & 0xffffffff;
    do {
      lVar10 = uVar11 + 1;
      uVar11 = uVar11 + 1;
      if (uVar13 <= uVar11) break;
    } while (local_260[lVar10] == ' ' || local_260[lVar10] == '\t');
    uVar3 = (uint)uVar11;
    if (uVar3 < (uint)local_258) {
      do {
        if ((local_260[uVar11] == ' ') || (local_260[uVar11] == '\t')) break;
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar13);
    }
    else {
      uVar11 = uVar11 & 0xffffffff;
    }
    iVar12 = iVar12 + 1;
    uVar17 = (uVar11 & 0xffffffff) - 1;
    do {
      lVar10 = uVar17 + 1;
      uVar17 = uVar17 + 1;
      if (uVar13 <= uVar17) break;
    } while (local_260[lVar10] == ' ' || local_260[lVar10] == '\t');
    uVar4 = (uint)uVar17;
    if (uVar4 < (uint)local_258) {
      do {
        if ((local_260[uVar17] == '\t') || (local_260[uVar17] == ' ')) break;
        uVar17 = uVar17 + 1;
      } while (uVar17 < uVar13);
    }
    else {
      uVar17 = uVar17 & 0xffffffff;
    }
    if ((uint)uVar11 <= uVar3) {
      __assert_fail("endc > startc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                    ,0x6f,
                    "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                   );
    }
    if (uVar4 <= (uint)uVar11) {
      __assert_fail("startw > endc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                    ,0x70,
                    "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                   );
    }
    if ((uint)uVar17 <= uVar4) {
      __assert_fail("endw > startw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                    ,0x71,
                    "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                   );
    }
    std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
    uVar3 = Dict::Convert(&this->cdict,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_) !=
        &local_280.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_));
    }
    std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
    uVar4 = Dict::Convert(local_240,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_) !=
        &local_280.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_));
    }
    uVar11 = (ulong)uVar4;
    piVar9 = (this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_29c = uVar4;
    if ((ulong)((long)(this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar9 >> 2) <= uVar11) {
      local_280._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (local_290,(ulong)(uVar4 + 1),(value_type_conflict1 *)&local_280);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (local_288,(ulong)(local_29c + 1));
      uVar11 = (ulong)local_29c;
      piVar9 = (local_290->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar9[uVar11] = uVar3;
    uVar13 = (ulong)uVar3;
    pvVar7 = (this->cidx2words).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(this->cidx2words).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
             -0x5555555555555555;
    if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(local_298,(ulong)(uVar3 + 1));
      pvVar7 = (local_298->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar7 + uVar13);
    __position._M_current = *(uint **)(this_00 + 8);
    (local_288->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start[local_29c] =
         (uint)((ulong)((long)__position._M_current - *(long *)this_00) >> 2);
    if (__position._M_current == *(uint **)(this_00 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this_00,__position,&local_29c);
    }
    else {
      *__position._M_current = local_29c;
      *(uint **)(this_00 + 8) = __position._M_current + 1;
    }
    lVar10 = *(long *)(local_238[0] + -0x18);
  } while( true );
}

Assistant:

void ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  while(getline(in, line)) {
    ++wc;
    const unsigned len = line.size();
    unsigned startc = 0;
    while (is_ws(line[startc]) && startc < len) { ++startc; }
    unsigned endc = startc;
    while (not_ws(line[endc]) && endc < len) { ++endc; }
    unsigned startw = endc;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endc > startc);
    assert(startw > endc);
    assert(endw > startw);
    unsigned c = cdict.Convert(line.substr(startc, endc - startc));
    unsigned word = word_dict->Convert(line.substr(startw, endw - startw));
    if (word >= widx2cidx.size()) {
      widx2cidx.resize(word + 1, -1);
      widx2cwidx.resize(word + 1);
    }
    widx2cidx[word] = c;
    if (c >= cidx2words.size()) cidx2words.resize(c + 1);
    auto& clusterwords = cidx2words[c];
    widx2cwidx[word] = clusterwords.size();
    clusterwords.push_back(word);
  }
  singleton_cluster.resize(cidx2words.size());
  int scs = 0;
  for (unsigned i = 0; i < cidx2words.size(); ++i) {
    bool sc = cidx2words[i].size() <= 1;
    if (sc) scs++;
    singleton_cluster[i] = sc;
  }
  cerr << "Read " << wc << " words in " << cdict.size() << " clusters (" << scs << " singleton clusters)\n";
}